

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanocat.c
# Opt level: O0

void nn_resp_loop(nn_options_t *options,int sock)

{
  int *piVar1;
  char *local_20;
  void *buf;
  int rc;
  int sock_local;
  nn_options_t *options_local;
  
  buf._4_4_ = sock;
  _rc = options;
LAB_0010400f:
  buf._0_4_ = nn_recv(buf._4_4_,&local_20,0xffffffffffffffff,0);
  if ((int)buf < 0) goto code_r0x0010402d;
  goto LAB_00104039;
code_r0x0010402d:
  piVar1 = __errno_location();
  if (*piVar1 != 0xb) {
LAB_00104039:
    nn_assert_errno((uint)(-1 < (int)buf),"Can\'t recv");
    nn_print_message(_rc,local_20,(int)buf);
    nn_freemsg(local_20);
    buf._0_4_ = nn_send(buf._4_4_,(_rc->data_to_send).data,(long)(_rc->data_to_send).length);
    if (((int)buf < 0) && (piVar1 = __errno_location(), *piVar1 == 0xb)) {
      fprintf(_stderr,"Message not sent (EAGAIN)\n");
    }
    else {
      nn_assert_errno((uint)(-1 < (int)buf),"Can\'t send");
    }
  }
  goto LAB_0010400f;
}

Assistant:

void nn_resp_loop (nn_options_t *options, int sock)
{
    int rc;
    void *buf;

    for (;;) {
        rc = nn_recv (sock, &buf, NN_MSG, 0);
        if (rc < 0 && errno == EAGAIN) {
                continue;
        } else {
            nn_assert_errno (rc >= 0, "Can't recv");
        }
        nn_print_message (options, buf, rc);
        nn_freemsg (buf);
        rc = nn_send (sock,
            options->data_to_send.data, options->data_to_send.length,
            0);
        if (rc < 0 && errno == EAGAIN) {
            fprintf (stderr, "Message not sent (EAGAIN)\n");
        } else {
            nn_assert_errno (rc >= 0, "Can't send");
        }
    }
}